

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O2

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/error_object.cpp:131:62)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_error_object_cpp:131:62)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  bool bVar1;
  gc_heap_ptr_untyped *this_00;
  long *plVar2;
  
  if (this_->type_ == object) {
    this_00 = &value::object_value(this_)->super_gc_heap_ptr_untyped;
    bVar1 = gc_heap_ptr_untyped::has_type<mjs::error_object>(this_00);
    if (bVar1) {
      gc_heap_ptr_untyped::get(this_00);
      error_object::to_string((error_object *)&stack0xffffffffffffffd8);
      value::value(__return_storage_ptr__,(string *)&stack0xffffffffffffffd8);
      goto LAB_0012c3d0;
    }
  }
  plVar2 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this->f);
  (**(code **)(*plVar2 + 0x98))(&stack0xffffffffffffffd8,plVar2,"Error");
  value::value(__return_storage_ptr__,(string *)&stack0xffffffffffffffd8);
LAB_0012c3d0:
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&stack0xffffffffffffffd8);
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }